

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLLoadBMPFailedDuringLoadTexture_Test::TestBody
          (SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLLoadBMPFailedDuringLoadTexture_Test
           *this)

{
  bool bVar1;
  WrapperMock *this_00;
  MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  TypedExpectation<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_02;
  char *message;
  AssertHelper local_f8;
  Message local_f0 [2];
  runtime_error *anon_var_0;
  type e;
  undefined1 local_b0 [8];
  _Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false> _Stack_a8;
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  PolymorphicAction local_79;
  Action<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_78;
  WithoutMatchers local_55 [13];
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_30;
  SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLLoadBMPFailedDuringLoadTexture_Test *local_10;
  SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLLoadBMPFailedDuringLoadTexture_Test *this_local;
  
  local_10 = this;
  this_00 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                       (&(this->super_SDLGraphicsSystemWithCreatedWindowTests).
                         super_SDLGraphicsSystemTests.sdlMock)->super_WrapperMock;
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_48,(string *)(anonymous_namespace)::texturePath_abi_cxx11_);
  SDL::WrapperMock::gmock_loadBMP(&local_30,this_00,&local_48);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_30,local_55,(void *)0x0);
  this_02 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0xf6,"*sdlMock","loadBMP(texturePath)");
  testing::ReturnNull();
  testing::PolymorphicAction::operator_cast_to_Action(&local_78,&local_79);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillOnce(this_02,&local_78);
  testing::
  Action<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~Action(&local_78);
  testing::internal::
  MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_30);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_48);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  _Stack_a8._M_head_impl = (Wrapper *)0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&stack0xffffffffffffff58);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool
                    ((TrueWithString *)&stack0xffffffffffffff58);
  if (bVar1) {
    local_b0[7] = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      SDLGraphicsSystem::loadTexture
                ((SDLGraphicsSystem *)local_b0,
                 (string *)
                 &(this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests
                  .system);
    }
    if ((local_b0[7] & 1) != 0) goto LAB_002d3417;
    std::__cxx11::string::operator=
              ((string *)&stack0xffffffffffffff58,
               "Expected: system.loadTexture(texturePath) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_f0);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0xf7,message);
  testing::internal::AssertHelper::operator=(&local_f8,local_f0);
  testing::internal::AssertHelper::~AssertHelper(&local_f8);
  testing::Message::~Message(local_f0);
LAB_002d3417:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&stack0xffffffffffffff58);
  SDLGraphicsSystemTests::expectQuitSystem((SDLGraphicsSystemTests *)this);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithCreatedWindowTests,
       throwIfSDLLoadBMPFailedDuringLoadTexture)
{
    EXPECT_CALL(*sdlMock, loadBMP(texturePath)).WillOnce(ReturnNull());
    EXPECT_THROW(system.loadTexture(texturePath), std::runtime_error);
    expectQuitSystem();
}